

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O0

void __thiscall dlib::drawable_window::on_wheel_up(drawable_window *this,unsigned_long state)

{
  unsigned_long uVar1;
  bool bVar2;
  T *ppdVar3;
  undefined8 in_RSI;
  long in_RDI;
  set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_00000200;
  
  *(long *)(in_RDI + 0x548) = *(long *)(in_RDI + 0x548) + 1;
  set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::reset((set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           *)0x499246);
  while (bVar2 = set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::move_next((set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                              *)0x499257), bVar2) {
    ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
              ::element(in_stack_00000200);
    if ((*ppdVar3)->event_id != *(unsigned_long *)(in_RDI + 0x548)) {
      uVar1 = *(unsigned_long *)(in_RDI + 0x548);
      ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                ::element(in_stack_00000200);
      (*ppdVar3)->event_id = uVar1;
      ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                ::element(in_stack_00000200);
      (*(*ppdVar3)->_vptr_drawable[0x13])(*ppdVar3,in_RSI);
    }
  }
  return;
}

Assistant:

void drawable_window::
    on_wheel_up (
        unsigned long state
    )
    {
        ++event_id;
        mouse_wheel.reset();
        while (mouse_wheel.move_next())
        {
            if (mouse_wheel.element()->event_id != event_id)
            {
                mouse_wheel.element()->event_id = event_id;
                mouse_wheel.element()->on_wheel_up(state);
            }
        }
    }